

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O3

bool __thiscall
duckdb::StringValueScanner::SkipUntilState
          (StringValueScanner *this,CSVState initial_state,CSVState until_state,
          CSVIterator *current_iterator,bool *quoted)

{
  ulong uVar1;
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  CSVState CVar2;
  char cVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  CSVStateMachine *pCVar10;
  char *pcVar11;
  bool bVar12;
  ulong uVar13;
  ulong uVar14;
  
  uVar4 = (current_iterator->boundary).end_pos;
  this_00 = &this->state_machine_strict;
  uVar1 = uVar4 - 1;
  bVar12 = true;
  uVar9 = (ulong)initial_state;
  do {
    if (uVar4 <= (current_iterator->pos).buffer_pos) {
      return false;
    }
    pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    pcVar11 = (this->super_BaseScanner).buffer_handle_ptr;
    iVar5 = (current_iterator->pos).buffer_pos;
    uVar14 = iVar5 + 1;
    (current_iterator->pos).buffer_pos = uVar14;
    CVar2 = pCVar10->transition_array->state_machine[(byte)pcVar11[iVar5]][uVar9];
    switch((ulong)CVar2) {
    case 0:
switchD_014f171a_caseD_0:
      uVar13 = iVar5 + 9;
      while (uVar13 < uVar4) {
        uVar14 = *(ulong *)((this->super_BaseScanner).buffer_handle_ptr + uVar14);
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar13 = pCVar10->transition_array->delimiter;
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar6 = pCVar10->transition_array->new_line;
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar7 = pCVar10->transition_array->carriage_return;
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar14 = (uVar14 ^ pCVar10->transition_array->comment) & (uVar7 ^ uVar14) &
                 (uVar6 ^ uVar14) & (uVar13 ^ uVar14);
        if ((~(0x101010101010100 - uVar14 | uVar14) & 0x8080808080808080) != 0) break;
        iVar5 = (current_iterator->pos).buffer_pos;
        uVar14 = iVar5 + 8;
        (current_iterator->pos).buffer_pos = uVar14;
        uVar13 = iVar5 + 0x10;
      }
      pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      pcVar11 = (this->super_BaseScanner).buffer_handle_ptr;
      uVar14 = (current_iterator->pos).buffer_pos;
      if (uVar14 < uVar1) {
        cVar3 = pCVar10->transition_array->skip_standard[(byte)pcVar11[uVar14]];
        while (cVar3 != '\0') {
          (current_iterator->pos).buffer_pos = uVar14 + 1;
          pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          pcVar11 = (this->super_BaseScanner).buffer_handle_ptr;
          uVar14 = (current_iterator->pos).buffer_pos;
          if (uVar1 <= uVar14) break;
          cVar3 = pCVar10->transition_array->skip_standard[(byte)pcVar11[uVar14]];
        }
      }
      uVar8 = (uint)CVar2;
      if ((uVar8 - 5 < 2) || (uVar8 == 1)) goto switchD_014f171a_caseD_1;
      if (uVar8 == 7) goto switchD_014f171a_caseD_7;
      break;
    case 1:
    case 5:
    case 6:
switchD_014f171a_caseD_1:
      if ((bVar12) &&
         (cVar3 = pcVar11[uVar14 - 1],
         pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
         cVar3 == (pCVar10->dialect_options).state_machine_options.quote.value)) {
        *quoted = true;
      }
      break;
    case 2:
    case 3:
    case 4:
      break;
    case 7:
switchD_014f171a_caseD_7:
      uVar13 = uVar14 + 8;
      while (uVar13 < uVar4) {
        uVar14 = *(ulong *)((this->super_BaseScanner).buffer_handle_ptr + uVar14);
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar13 = pCVar10->transition_array->quote;
        pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
        uVar14 = (uVar14 ^ pCVar10->transition_array->escape) & (uVar13 ^ uVar14);
        if ((~(0x101010101010100 - uVar14 | uVar14) & 0x8080808080808080) != 0) break;
        iVar5 = (current_iterator->pos).buffer_pos;
        uVar14 = iVar5 + 8;
        (current_iterator->pos).buffer_pos = uVar14;
        uVar13 = iVar5 + 0x10;
      }
      pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      pcVar11 = (this->super_BaseScanner).buffer_handle_ptr;
      uVar14 = (current_iterator->pos).buffer_pos;
      if (uVar14 < uVar1) {
        cVar3 = pCVar10->transition_array->skip_quoted[(byte)pcVar11[uVar14]];
        while (cVar3 != '\0') {
          (current_iterator->pos).buffer_pos = uVar14 + 1;
          pCVar10 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
          pcVar11 = (this->super_BaseScanner).buffer_handle_ptr;
          uVar14 = (current_iterator->pos).buffer_pos;
          if (uVar1 <= uVar14) break;
          cVar3 = pCVar10->transition_array->skip_quoted[(byte)pcVar11[uVar14]];
        }
      }
      if ((CVar2 < 7) && ((0x62U >> (CVar2 & 0x1f) & 1) != 0)) goto switchD_014f171a_caseD_1;
      break;
    default:
      if (CVar2 == STANDARD_NEWLINE) goto switchD_014f171a_caseD_0;
    }
    if (CVar2 == until_state) {
      return true;
    }
    bVar12 = (bool)(bVar12 & (char)uVar9 != '\x01');
    uVar9 = (ulong)CVar2;
    if (CVar2 == INVALID) {
      return false;
    }
  } while( true );
}

Assistant:

bool StringValueScanner::SkipUntilState(CSVState initial_state, CSVState until_state, CSVIterator &current_iterator,
                                        bool &quoted) const {
	CSVStates current_state;
	current_state.Initialize(initial_state);
	bool first_column = true;
	const idx_t to_pos = current_iterator.GetEndPos();
	while (current_iterator.pos.buffer_pos < to_pos) {
		state_machine_strict->Transition(current_state, buffer_handle_ptr[current_iterator.pos.buffer_pos++]);
		if (current_state.IsState(CSVState::STANDARD) || current_state.IsState(CSVState::STANDARD_NEWLINE)) {
			while (current_iterator.pos.buffer_pos + 8 < to_pos) {
				uint64_t value = Load<uint64_t>(
				    reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[current_iterator.pos.buffer_pos]));
				if (ContainsZeroByte((value ^ state_machine_strict->transition_array.delimiter) &
				                     (value ^ state_machine_strict->transition_array.new_line) &
				                     (value ^ state_machine_strict->transition_array.carriage_return) &
				                     (value ^ state_machine_strict->transition_array.comment))) {
					break;
				}
				current_iterator.pos.buffer_pos += 8;
			}
			while (state_machine_strict->transition_array
			           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[current_iterator.pos.buffer_pos])] &&
			       current_iterator.pos.buffer_pos < to_pos - 1) {
				current_iterator.pos.buffer_pos++;
			}
		}
		if (current_state.IsState(CSVState::QUOTED)) {
			while (current_iterator.pos.buffer_pos + 8 < to_pos) {
				uint64_t value = Load<uint64_t>(
				    reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[current_iterator.pos.buffer_pos]));
				if (ContainsZeroByte((value ^ state_machine_strict->transition_array.quote) &
				                     (value ^ state_machine_strict->transition_array.escape))) {
					break;
				}
				current_iterator.pos.buffer_pos += 8;
			}

			while (state_machine_strict->transition_array
			           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[current_iterator.pos.buffer_pos])] &&
			       current_iterator.pos.buffer_pos < to_pos - 1) {
				current_iterator.pos.buffer_pos++;
			}
		}
		if ((current_state.IsState(CSVState::DELIMITER) || current_state.IsState(CSVState::CARRIAGE_RETURN) ||
		     current_state.IsState(CSVState::RECORD_SEPARATOR)) &&
		    first_column) {
			if (buffer_handle_ptr[current_iterator.pos.buffer_pos - 1] ==
			    state_machine_strict->dialect_options.state_machine_options.quote.GetValue()) {
				quoted = true;
			}
		}
		if (current_state.WasState(CSVState::DELIMITER)) {
			first_column = false;
		}
		if (current_state.IsState(until_state)) {
			return true;
		}
		if (current_state.IsState(CSVState::INVALID)) {
			return false;
		}
	}
	return false;
}